

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Win_shared_query(MPIABI_Win win,int rank,MPIABI_Aint *size,int *disp_unit,void *baseptr)

{
  int iVar1;
  ompi_win_t *poVar2;
  WPI_Handle<ompi_win_t_*> local_38;
  void *local_30;
  void *baseptr_local;
  int *disp_unit_local;
  MPIABI_Aint *size_local;
  MPIABI_Win MStack_10;
  int rank_local;
  MPIABI_Win win_local;
  
  local_30 = baseptr;
  baseptr_local = disp_unit;
  disp_unit_local = (int *)size;
  size_local._4_4_ = rank;
  MStack_10 = win;
  WPI_Handle<ompi_win_t_*>::WPI_Handle(&local_38,win);
  poVar2 = WPI_Handle::operator_cast_to_ompi_win_t_((WPI_Handle *)&local_38);
  iVar1 = MPI_Win_shared_query(poVar2,size_local._4_4_,disp_unit_local,baseptr_local,local_30);
  return iVar1;
}

Assistant:

int MPIABI_Win_shared_query(
  MPIABI_Win win,
  int rank,
  MPIABI_Aint * size,
  int * disp_unit,
  void * baseptr
) {
  return MPI_Win_shared_query(
    (MPI_Win)(WPI_Win)win,
    rank,
    (MPI_Aint *)(WPI_Aint *)size,
    disp_unit,
    baseptr
  );
}